

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_privkey.cpp
# Opt level: O0

void __thiscall
Privkey_TweakConversionTest_Test::~Privkey_TweakConversionTest_Test
          (Privkey_TweakConversionTest_Test *this)

{
  Privkey_TweakConversionTest_Test *this_local;
  
  ~Privkey_TweakConversionTest_Test(this);
  operator_delete(this);
  return;
}

Assistant:

TEST(Privkey, TweakConversionTest) {
  Privkey privkey("036b13c5a0dd9935fe175b2b9ff86585c231e734b2148149d788a941f1f4f566");
  ByteData256 tweak("98430d10471cf697e2661e31ceb8720750b59a85374290e175799ba5dd06508e");

  // test for adding tweak
  {
    Privkey priv_tweak_added;
    EXPECT_NO_THROW(priv_tweak_added = privkey.CreateTweakAdd(tweak));
    EXPECT_STREQ(priv_tweak_added.GetHex().c_str(), "9bae20d5e7fa8fcde07d795d6eb0d78d12e781b9e957122b4d0244e7cefb45f4");

    Pubkey expect_pubkey = privkey.GeneratePubkey().CreateTweakAdd(tweak);
    EXPECT_TRUE(expect_pubkey.Equals(priv_tweak_added.GeneratePubkey()));
  }

  // test for multiplying tweak
  {
    Privkey priv_tweak_mul;
    EXPECT_NO_THROW(priv_tweak_mul = privkey.CreateTweakMul(tweak));
    EXPECT_STREQ(priv_tweak_mul.GetHex().c_str(), "aa71b12accba23b49761a7521e661f07a7e5742ac48cf708b8f9497b3a72a957");

    Pubkey expect_pubkey = privkey.GeneratePubkey().CreateTweakMul(tweak);
    EXPECT_TRUE(expect_pubkey.Equals(priv_tweak_mul.GeneratePubkey()));
  }
}